

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.h
# Opt level: O0

void wasm::Names::ensureNames(Function *func)

{
  mapped_type mVar1;
  bool bVar2;
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  *this;
  reference __in;
  type *__x;
  size_type sVar3;
  ulong uVar4;
  size_t sVar5;
  mapped_type *this_00;
  mapped_type *pmVar6;
  Name NVar7;
  pair<std::__detail::_Node_iterator<wasm::Name,_true,_true>,_bool> pVar8;
  undefined1 local_b0 [8];
  Name name_1;
  Index i;
  Index nameIndex;
  type *name;
  type *_;
  _Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false> local_60;
  iterator __end2;
  iterator __begin2;
  unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
  *__range2;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  seen;
  Function *func_local;
  
  seen._M_h._M_single_bucket = (__node_base_ptr)func;
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&__range2);
  this = (unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
          *)(seen._M_h._M_single_bucket + 0xe);
  __end2 = std::
           unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
           ::begin(this);
  local_60._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
       ::end(this);
  while (bVar2 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::Name>,_false>
                            ,&local_60), bVar2) {
    __in = std::__detail::_Node_iterator<std::pair<const_unsigned_int,_wasm::Name>,_false,_false>::
           operator*(&__end2);
    std::get<0ul,unsigned_int_const,wasm::Name>(__in);
    __x = std::get<1ul,unsigned_int_const,wasm::Name>(__in);
    std::
    unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
    ::insert((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
              *)&__range2,__x);
    std::__detail::_Node_iterator<std::pair<const_unsigned_int,_wasm::Name>,_false,_false>::
    operator++(&__end2);
  }
  sVar3 = std::
          unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
          ::size((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                  *)&__range2);
  name_1.super_IString.str._M_str._4_4_ = (uint)sVar3;
  for (name_1.super_IString.str._M_str._0_4_ = 0;
      uVar4 = (ulong)(uint)name_1.super_IString.str._M_str,
      sVar5 = Function::getNumLocals((Function *)seen._M_h._M_single_bucket), uVar4 < sVar5;
      name_1.super_IString.str._M_str._0_4_ = (uint)name_1.super_IString.str._M_str + 1) {
    bVar2 = Function::hasLocalName
                      ((Function *)seen._M_h._M_single_bucket,(uint)name_1.super_IString.str._M_str)
    ;
    if (!bVar2) {
      do {
        uVar4 = (ulong)name_1.super_IString.str._M_str._4_4_;
        name_1.super_IString.str._M_str._4_4_ = name_1.super_IString.str._M_str._4_4_ + 1;
        NVar7 = wasm::Name::fromInt(uVar4);
        name_1.super_IString.str._M_len = NVar7.super_IString.str._M_str;
        local_b0 = NVar7.super_IString.str._M_len;
        pVar8 = std::
                unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>
                ::emplace<wasm::Name&>
                          ((unordered_set<wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<wasm::Name>>
                            *)&__range2,(Name *)local_b0);
      } while (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
      this_00 = std::
                unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                ::operator[]((unordered_map<unsigned_int,_wasm::Name,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>_>
                              *)(seen._M_h._M_single_bucket + 0xe),
                             (key_type *)&name_1.super_IString.str._M_str);
      wasm::Name::operator=(this_00,(Name *)local_b0);
      mVar1 = (uint)name_1.super_IString.str._M_str;
      pmVar6 = std::
               unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
               ::operator[]((unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                             *)(seen._M_h._M_single_bucket + 0x15),(Name *)local_b0);
      *pmVar6 = mVar1;
    }
  }
  std::
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~unordered_set((unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                    *)&__range2);
  return;
}

Assistant:

inline void ensureNames(Function* func) {
  std::unordered_set<Name> seen;
  for (auto& [_, name] : func->localNames) {
    seen.insert(name);
  }
  Index nameIndex = seen.size();
  for (Index i = 0; i < func->getNumLocals(); i++) {
    if (!func->hasLocalName(i)) {
      while (1) {
        auto name = Name::fromInt(nameIndex++);
        if (seen.emplace(name).second) {
          func->localNames[i] = name;
          func->localIndices[name] = i;
          break;
        }
      }
    }
  }
}